

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O0

MPP_RET mpp_buffer_import_with_tag
                  (MppBufferGroup group,MppBufferInfo *info,MppBuffer *buffer,char *tag,char *caller
                  )

{
  MppBufferImpl *local_50;
  MppBufferImpl *buf;
  MppBufferGroupImpl *pMStack_40;
  MPP_RET ret;
  MppBufferGroupImpl *p;
  char *caller_local;
  char *tag_local;
  MppBuffer *buffer_local;
  MppBufferInfo *info_local;
  MppBufferGroup group_local;
  
  p = (MppBufferGroupImpl *)caller;
  caller_local = tag;
  tag_local = (char *)buffer;
  buffer_local = (MppBuffer *)info;
  info_local = (MppBufferInfo *)group;
  if (info == (MppBufferInfo *)0x0) {
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_commit invalid input: info NULL from %s\n",(char *)0x0,
               caller);
    group_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    pMStack_40 = (MppBufferGroupImpl *)group;
    if (group == (MppBufferGroup)0x0) {
      pMStack_40 = mpp_buffer_get_misc_group(MPP_BUFFER_EXTERNAL,info->type);
    }
    else if ((((*(MppBufferType *)((long)group + 0x4c) & 0xffff) != info->type) ||
             (4 < (*(uint *)((long)group + 0x4c) & 0xffff))) || (*(int *)((long)group + 0x48) != 1))
    {
      _mpp_log_l(2,"mpp_buffer",
                 "mpp_buffer_commit invalid type found group %d info %d group mode %d from %s\n",
                 (char *)0x0,(ulong)*(uint *)((long)group + 0x4c),(ulong)info->type,
                 *(undefined4 *)((long)group + 0x48),caller);
      return MPP_ERR_UNKNOW;
    }
    if ((pMStack_40 == (MppBufferGroupImpl *)0x0) &&
       (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,"p",
                   "mpp_buffer_import_with_tag",0x32), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    buf._4_4_ = 0;
    if (tag_local == (char *)0x0) {
      buf._4_4_ = mpp_buffer_create(caller_local,p->tag,pMStack_40,(MppBufferInfo *)buffer_local,
                                    (MppBufferImpl **)0x0);
    }
    else {
      local_50 = (MppBufferImpl *)0x0;
      buf._4_4_ = mpp_buffer_create(caller_local,p->tag,pMStack_40,(MppBufferInfo *)buffer_local,
                                    &local_50);
      *(MppBufferImpl **)tag_local = local_50;
    }
    group_local._4_4_ = buf._4_4_;
  }
  return group_local._4_4_;
}

Assistant:

MPP_RET mpp_buffer_import_with_tag(MppBufferGroup group, MppBufferInfo *info, MppBuffer *buffer,
                                   const char *tag, const char *caller)
{
    if (NULL == info) {
        mpp_err("mpp_buffer_commit invalid input: info NULL from %s\n", caller);
        return MPP_ERR_NULL_PTR;
    }

    MppBufferGroupImpl *p = (MppBufferGroupImpl *)group;

    if (p) {
        // if group is specified we need to check the parameter
        if ((p->type & MPP_BUFFER_TYPE_MASK) != info->type ||
            (p->type & MPP_BUFFER_TYPE_MASK) >= MPP_BUFFER_TYPE_BUTT ||
            p->mode != MPP_BUFFER_EXTERNAL) {
            mpp_err("mpp_buffer_commit invalid type found group %d info %d group mode %d from %s\n",
                    p->type, info->type, p->mode, caller);
            return MPP_ERR_UNKNOW;
        }
    } else {
        // otherwise use default external group to manage them
        p = mpp_buffer_get_misc_group(MPP_BUFFER_EXTERNAL, info->type);
    }

    mpp_assert(p);

    MPP_RET ret = MPP_OK;
    if (buffer) {
        MppBufferImpl *buf = NULL;
        ret = mpp_buffer_create(tag, caller, p, info, &buf);
        *buffer = buf;
    } else {
        ret = mpp_buffer_create(tag, caller, p, info, NULL);
    }
    return ret;
}